

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3e503::CleanTest::~CleanTest(CleanTest *this)

{
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__CleanTest_001bd9d8;
  VirtualFileSystem::~VirtualFileSystem(&this->fs_);
  StateTestWithBuiltinRules::~StateTestWithBuiltinRules(&this->super_StateTestWithBuiltinRules);
  return;
}

Assistant:

virtual void SetUp() {
    config_.verbosity = BuildConfig::QUIET;
  }